

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sampleCopy(Stat4Accum *p,Stat4Sample *pTo,Stat4Sample *pFrom)

{
  u32 uVar1;
  
  pTo->isPSample = pFrom->isPSample;
  uVar1 = pFrom->iHash;
  pTo->iCol = pFrom->iCol;
  pTo->iHash = uVar1;
  memcpy(pTo->anEq,pFrom->anEq,(long)p->nCol << 2);
  memcpy(pTo->anLt,pFrom->anLt,(long)p->nCol << 2);
  memcpy(pTo->anDLt,pFrom->anDLt,(long)p->nCol << 2);
  if (pFrom->nRowid != 0) {
    sampleSetRowid(p->db,pTo,pFrom->nRowid,(pFrom->u).aRowid);
    return;
  }
  sampleSetRowidInt64(p->db,pTo,(pFrom->u).iRowid);
  return;
}

Assistant:

static void sampleCopy(Stat4Accum *p, Stat4Sample *pTo, Stat4Sample *pFrom){
  pTo->isPSample = pFrom->isPSample;
  pTo->iCol = pFrom->iCol;
  pTo->iHash = pFrom->iHash;
  memcpy(pTo->anEq, pFrom->anEq, sizeof(tRowcnt)*p->nCol);
  memcpy(pTo->anLt, pFrom->anLt, sizeof(tRowcnt)*p->nCol);
  memcpy(pTo->anDLt, pFrom->anDLt, sizeof(tRowcnt)*p->nCol);
  if( pFrom->nRowid ){
    sampleSetRowid(p->db, pTo, pFrom->nRowid, pFrom->u.aRowid);
  }else{
    sampleSetRowidInt64(p->db, pTo, pFrom->u.iRowid);
  }
}